

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

string * __thiscall
TransitionObservationIndependentMADPDiscrete::SoftPrintActionSets_abi_cxx11_
          (string *__return_storage_ptr__,TransitionObservationIndependentMADPDiscrete *this)

{
  ostream *poVar1;
  ulong uVar2;
  ActionDiscrete *pAVar3;
  E *this_00;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  stringstream ss;
  ostream local_330 [376];
  stringstream str;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  if (this->_m_initialized != false) {
    poVar1 = std::operator<<(local_1a8,"Actions:");
    std::endl<char,std::char_traits<char>>(poVar1);
    for (uVar4 = 0; uVar5 = (ulong)uVar4,
        uVar5 < (this->super_MultiAgentDecisionProcess)._m_nrAgents; uVar4 = uVar4 + 1) {
      poVar1 = std::operator<<(local_1a8,"agentI ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1," - nrActions ");
      (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x48))(this,uVar5);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      uVar6 = 0;
      while( true ) {
        uVar2 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x48))(this);
        if (uVar2 <= uVar6) break;
        pAVar3 = MADPComponentDiscreteActions::GetActionDiscrete
                           (&(this->_m_individualMADPDs).
                             super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar5]->_m_A,0,(Index)uVar6);
        (*(pAVar3->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity[2])
                  ((string *)&ss,pAVar3);
        std::operator<<(local_1a8,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        std::endl<char,std::char_traits<char>>(local_1a8);
        uVar6 = (ulong)((Index)uVar6 + 1);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_330,"TransitionObservationIndependentMADPDiscrete::PrintAction");
  poVar1 = std::operator<<(poVar1,"Sets() - Error: not initialized. ");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

string TransitionObservationIndependentMADPDiscrete::SoftPrintActionSets() const
{
    stringstream str;
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "TransitionObservationIndependentMADPDiscrete::PrintAction"<<
                "Sets() - Error: not initialized. "<<endl;
        throw E(ss);
    }    
    str << "Actions:"<<endl;
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        str << "agentI " << agentIndex << " - nrActions " << 
            GetNrActions(agentIndex)<<endl; 
        for(Index actionI=0; actionI < GetNrActions(agentIndex); actionI++)
        {

            const ActionDiscrete * adp = GetIndividualMADPD(agentIndex)->
                GetActionDiscrete(0, actionI);
            str << adp->SoftPrint();
            str << endl;
        }
    }
    return(str.str());
}